

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool container_select(container_t *c,uint8_t type,uint32_t *start_rank,uint32_t rank,
                      uint32_t *element)

{
  uint32_t *element_local;
  uint32_t rank_local;
  uint32_t *start_rank_local;
  array_container_t *paStack_18;
  uint8_t type_local;
  container_t *c_local;
  
  start_rank_local._7_1_ = type;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)
               container_unwrap_shared(c,(uint8_t *)((long)&start_rank_local + 7));
  if (start_rank_local._7_1_ == '\x01') {
    c_local._7_1_ =
         bitset_container_select((bitset_container_t *)paStack_18,start_rank,rank,element);
  }
  else if (start_rank_local._7_1_ == '\x02') {
    c_local._7_1_ = array_container_select(paStack_18,start_rank,rank,element);
  }
  else {
    if (start_rank_local._7_1_ != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x18b0,
                    "_Bool container_select(const container_t *, uint8_t, uint32_t *, uint32_t, uint32_t *)"
                   );
    }
    c_local._7_1_ = run_container_select((run_container_t *)paStack_18,start_rank,rank,element);
  }
  return c_local._7_1_;
}

Assistant:

static inline bool container_select(
    const container_t *c, uint8_t type,
    uint32_t *start_rank, uint32_t rank,
    uint32_t *element
){
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_select(const_CAST_bitset(c),
                                           start_rank, rank, element);
        case ARRAY_CONTAINER_TYPE:
            return array_container_select(const_CAST_array(c),
                                          start_rank, rank, element);
        case RUN_CONTAINER_TYPE:
            return run_container_select(const_CAST_run(c),
                                        start_rank, rank, element);
        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return false;
}